

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::Script::Script(Script *this,string *hex)

{
  undefined1 local_58 [8];
  ByteData data;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string *hex_local;
  Script *this_local;
  
  this->_vptr_Script = (_func_int **)&PTR__Script_00880270;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)hex;
  ByteData::ByteData(&this->script_data_);
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&this->script_stack_);
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
             (string *)
             buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ByteData::ByteData((ByteData *)local_58,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  SetStackData(this,(ByteData *)local_58);
  ByteData::operator=(&this->script_data_,(ByteData *)local_58);
  ByteData::~ByteData((ByteData *)local_58);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

Script::Script(const std::string& hex) : script_data_(), script_stack_() {
  std::vector<uint8_t> buffer = StringUtil::StringToByte(hex);
  ByteData data = ByteData(buffer);
  SetStackData(data);
  script_data_ = data;
}